

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int skip_dead_code(JSFunctionDef *s,uint8_t *bc_buf,int bc_len,int pos,int *linep)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  int iVar4;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  JSFunctionDef *in_RDI;
  uint32_t *in_R8;
  JSAtom atom;
  int label;
  int len;
  int op;
  uint32_t in_stack_ffffffffffffffd4;
  int local_18;
  
  local_18 = in_ECX;
  do {
    if (in_EDX <= local_18) {
      return local_18;
    }
    uVar2 = (uint)*(byte *)(in_RSI + local_18);
    bVar1 = opcode_info[(int)uVar2].size;
    if (uVar2 == 0xc0) {
      uVar3 = get_u32((uint8_t *)(in_RSI + local_18 + 1));
      *in_R8 = uVar3;
    }
    else if (uVar2 == 0xb4) {
      in_stack_ffffffffffffffd4 = get_u32((uint8_t *)(in_RSI + local_18 + 1));
      iVar4 = update_label(in_RDI,in_stack_ffffffffffffffd4,0);
      if (0 < iVar4) {
        return local_18;
      }
    }
    else {
      uVar2 = (uint)opcode_info[(int)uVar2].fmt;
      if (uVar2 == 0x16) {
LAB_001a5fb7:
        in_stack_ffffffffffffffd4 = get_u32((uint8_t *)(in_RSI + local_18 + 1));
        update_label(in_RDI,in_stack_ffffffffffffffd4,-1);
      }
      else {
        if (2 < uVar2 - 0x17) {
          if (1 < uVar2 - 0x1a) {
            if (uVar2 != 0x1c) goto LAB_001a6046;
            goto LAB_001a5fb7;
          }
          in_stack_ffffffffffffffd4 = get_u32((uint8_t *)(in_RSI + local_18 + 5));
          update_label(in_RDI,in_stack_ffffffffffffffd4,-1);
        }
        uVar3 = get_u32((uint8_t *)(in_RSI + local_18 + 1));
        JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffd4,uVar3),uVar2);
      }
    }
LAB_001a6046:
    local_18 = (uint)bVar1 + local_18;
  } while( true );
}

Assistant:

static int skip_dead_code(JSFunctionDef *s, const uint8_t *bc_buf, int bc_len,
                          int pos, int *linep)
{
    int op, len, label;

    for (; pos < bc_len; pos += len) {
        op = bc_buf[pos];
        len = opcode_info[op].size;
        if (op == OP_line_num) {
            *linep = get_u32(bc_buf + pos + 1);
        } else
        if (op == OP_label) {
            label = get_u32(bc_buf + pos + 1);
            if (update_label(s, label, 0) > 0)
                break;
#if 0
            if (s->label_slots[label].first_reloc) {
                printf("line %d: unreferenced label %d:%d has relocations\n",
                       *linep, label, s->label_slots[label].pos2);
            }
#endif
            assert(s->label_slots[label].first_reloc == NULL);
        } else {
            /* XXX: output a warning for unreachable code? */
            JSAtom atom;
            switch(opcode_info[op].fmt) {
            case OP_FMT_label:
            case OP_FMT_label_u16:
                label = get_u32(bc_buf + pos + 1);
                update_label(s, label, -1);
                break;
            case OP_FMT_atom_label_u8:
            case OP_FMT_atom_label_u16:
                label = get_u32(bc_buf + pos + 5);
                update_label(s, label, -1);
                /* fall thru */
            case OP_FMT_atom:
            case OP_FMT_atom_u8:
            case OP_FMT_atom_u16:
                atom = get_u32(bc_buf + pos + 1);
                JS_FreeAtom(s->ctx, atom);
                break;
            default:
                break;
            }
        }
    }
    return pos;
}